

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

ResetPtr __thiscall libcellml::AnyCellmlElement::reset(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::Reset> sVar2;
  ResetPtr RVar3;
  bad_any_cast *anon_var_0;
  AnyCellmlElement *this_local;
  
  if (((*(int *)*in_RSI == 8) || (*(int *)*in_RSI == 9)) || (*(int *)*in_RSI == 10)) {
    sVar2 = std::any_cast<std::shared_ptr<libcellml::Reset>>((any *)this);
    _Var1 = sVar2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  else {
    std::shared_ptr<libcellml::Reset>::shared_ptr
              ((shared_ptr<libcellml::Reset> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr AnyCellmlElement::reset() const
{
    if ((mPimpl->mType == CellmlElementType::RESET)
        || (mPimpl->mType == CellmlElementType::RESET_VALUE)
        || (mPimpl->mType == CellmlElementType::TEST_VALUE)) {
        try {
            return std::any_cast<ResetPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}